

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

object * player_best_digger(player *p,_Bool forbid_stack)

{
  uint8_t uVar1;
  object *obj;
  _Bool _Var2;
  wchar_t slot;
  object *poVar3;
  object **ppoVar4;
  object *poVar5;
  int local_15c;
  player_state_conflict local_state;
  
  slot = slot_by_name(p,"weapon");
  poVar3 = slot_object(p,slot);
  local_15c = -1;
  poVar5 = (object *)0x0;
  ppoVar4 = &p->gear;
  while (obj = *ppoVar4, obj != (object *)0x0) {
    _Var2 = tval_is_melee_weapon(obj);
    if (((_Var2) && ((obj->number == '\x01' || !forbid_stack) && obj->number != '\0')) &&
       (_Var2 = obj_can_takeoff(obj), _Var2)) {
      uVar1 = obj->number;
      if (obj != poVar3) {
        obj->number = '\x01';
        (p->body).slots[slot].obj = obj;
      }
      local_state.stat_ind[0] = 0;
      local_state.stat_ind[3] = 0;
      calc_bonuses(p,&local_state,true,false);
      if (obj != poVar3) {
        obj->number = uVar1;
        (p->body).slots[slot].obj = poVar3;
      }
      if (local_15c < local_state.skills[9]) {
        poVar5 = obj;
        local_15c = local_state.skills[9];
      }
    }
    ppoVar4 = &obj->next;
  }
  return poVar5;
}

Assistant:

struct object *player_best_digger(struct player *p, bool forbid_stack)
{
	int weapon_slot = slot_by_name(p, "weapon");
	struct object *current_weapon = slot_object(p, weapon_slot);
	struct object *obj, *best = NULL;
	/* Prefer any melee weapon over unarmed digging, i.e. best == NULL. */
	int best_score = -1;
	struct player_state local_state;

	for (obj = p->gear; obj; obj = obj->next) {
		int score, old_number;
		if (!tval_is_melee_weapon(obj)) continue;
		if (obj->number < 1 || (forbid_stack && obj->number > 1)) continue;
		/* Don't use it if it has a sticky curse. */
		if (!obj_can_takeoff(obj)) continue;

		/* Swap temporarily for the calc_bonuses() computation. */
		old_number = obj->number;
		if (obj != current_weapon) {
			obj->number = 1;
			p->body.slots[weapon_slot].obj = obj;
		}

		/*
		 * Avoid side effects from using update set to false
		 * with calc_bonuses().
		 */
		local_state.stat_ind[STAT_STR] = 0;
		local_state.stat_ind[STAT_DEX] = 0;
		calc_bonuses(p, &local_state, true, false);
		score = local_state.skills[SKILL_DIGGING];

		/* Swap back. */
		if (obj != current_weapon) {
			obj->number = old_number;
			p->body.slots[weapon_slot].obj = current_weapon;
		}

		if (score > best_score) {
			best = obj;
			best_score = score;
		}
	}

	return best;
}